

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O1

bool __thiscall lzham::lzcompressor::send_zlib_header(lzcompressor *this)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  char cVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  
  if (((this->m_params).m_lzham_compress_flags & 0x20) != 0) {
    uVar6 = (ulong)(this->m_params).m_compression_level;
    iVar9 = (this->m_params).m_dict_size_log2 * 0x10 + -0xe2;
    uVar7 = 0xc0;
    if (uVar6 < 4) {
      uVar7 = *(uint *)(&DAT_00111080 + uVar6 * 4);
    }
    uVar2 = uVar7 | 0x20;
    if ((this->m_params).m_pSeed_bytes == (void *)0x0) {
      uVar2 = uVar7;
    }
    iVar8 = (int)(iVar9 * 0x100 | uVar2) % 0x1f;
    uVar7 = (uVar2 | 0x1f) - iVar8;
    if (iVar8 == 0) {
      uVar7 = uVar2;
    }
    uVar10 = (int)this + 0x3950;
    uVar2 = (this->m_comp_buf).m_size;
    if (((this->m_comp_buf).m_capacity <= uVar2) &&
       (cVar5 = lzham::elemental_vector::increase_capacity
                          (uVar10,(bool)((char)uVar2 + '\x01'),1,
                           (_func_void_void_ptr_void_ptr_uint *)0x1,false), cVar5 == '\0')) {
      return false;
    }
    (this->m_comp_buf).m_p[(this->m_comp_buf).m_size] = (uchar)iVar9;
    uVar3 = (this->m_comp_buf).m_size;
    uVar2 = uVar3 + 1;
    (this->m_comp_buf).m_size = uVar2;
    if (((this->m_comp_buf).m_capacity <= uVar2) &&
       (cVar5 = lzham::elemental_vector::increase_capacity
                          (uVar10,(bool)((char)uVar3 + '\x02'),1,
                           (_func_void_void_ptr_void_ptr_uint *)0x1,false), cVar5 == '\0')) {
      return false;
    }
    (this->m_comp_buf).m_p[(this->m_comp_buf).m_size] = (uchar)uVar7;
    puVar1 = &(this->m_comp_buf).m_size;
    *puVar1 = *puVar1 + 1;
    pvVar4 = (this->m_params).m_pSeed_bytes;
    if (pvVar4 != (void *)0x0) {
      iVar9 = lzham::adler32(pvVar4,(ulong)(this->m_params).m_num_seed_bytes,1);
      iVar8 = 4;
      do {
        uVar7 = (this->m_comp_buf).m_size;
        if (((this->m_comp_buf).m_capacity <= uVar7) &&
           (cVar5 = lzham::elemental_vector::increase_capacity
                              (uVar10,(bool)((char)uVar7 + '\x01'),1,
                               (_func_void_void_ptr_void_ptr_uint *)0x1,false), cVar5 == '\0')) {
          return false;
        }
        (this->m_comp_buf).m_p[(this->m_comp_buf).m_size] = (uchar)((uint)iVar9 >> 0x18);
        puVar1 = &(this->m_comp_buf).m_size;
        *puVar1 = *puVar1 + 1;
        iVar9 = iVar9 << 8;
        iVar8 = iVar8 + -1;
      } while (iVar8 != 0);
    }
  }
  return true;
}

Assistant:

bool lzcompressor::send_zlib_header()
   {
      if ((m_params.m_lzham_compress_flags & LZHAM_COMP_FLAG_WRITE_ZLIB_STREAM) == 0)
         return true;

      // set CM (method) and CINFO (dictionary size) fields
      int cmf = LZHAM_Z_LZHAM | ((m_params.m_dict_size_log2 - 15) << 4);

      // set FLEVEL by mapping LZHAM's compression level to zlib's
      int flg = 0;
      switch (m_params.m_compression_level)
      {
         case LZHAM_COMP_LEVEL_FASTEST:
         {
            flg = 0 << 6;
            break;
         }
         case LZHAM_COMP_LEVEL_FASTER:
         {
            flg = 1 << 6;
            break;
         }
         case LZHAM_COMP_LEVEL_DEFAULT:
         case LZHAM_COMP_LEVEL_BETTER:
         {
            flg = 2 << 6;
            break;
         }
         default:
         {
            flg = 3 << 6;
            break;
         }
      }

      // set FDICT flag
      if (m_params.m_pSeed_bytes)
         flg |= 32;

      int check = ((cmf << 8) + flg) % 31;
      if (check)
         flg += (31 - check);

      LZHAM_ASSERT(0 == (((cmf << 8) + flg) % 31));
      if (!m_comp_buf.try_push_back(static_cast<uint8>(cmf)))
         return false;
      if (!m_comp_buf.try_push_back(static_cast<uint8>(flg)))
         return false;

      if (m_params.m_pSeed_bytes)
      {
         // send adler32 of DICT
         uint dict_adler32 = adler32(m_params.m_pSeed_bytes, m_params.m_num_seed_bytes);
         for (uint i = 0; i < 4; i++)
         {
            if (!m_comp_buf.try_push_back(static_cast<uint8>(dict_adler32 >> 24)))
               return false;
            dict_adler32 <<= 8;
         }
      }

      return true;
   }